

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int *piVar1;
  uint uVar2;
  char *pcVar3;
  ImGuiOldColumns *pIVar4;
  void *pvVar5;
  ImGuiStoragePair *pIVar6;
  float *pfVar7;
  ImGuiWindow **ppIVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  if (this->DrawList != &this->DrawListInst) {
    __assert_fail("DrawList == &DrawListInst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xb43,"ImGuiWindow::~ImGuiWindow()");
  }
  pcVar3 = this->Name;
  if (pcVar3 != (char *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
  }
  uVar2 = (this->ColumnsStorage).Size;
  uVar10 = (ulong)uVar2;
  if (uVar2 != 0) {
    lVar12 = 0x68;
    uVar11 = 0;
    do {
      if ((long)(int)uVar10 <= (long)uVar11) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,"T &ImVector<ImGuiOldColumns>::operator[](int) [T = ImGuiOldColumns]");
      }
      pIVar4 = (this->ColumnsStorage).Data;
      ImDrawListSplitter::ClearFreeMemory((ImDrawListSplitter *)(&pIVar4->IsFirstFrame + lVar12));
      pvVar5 = *(void **)((long)&pIVar4->OffMaxX + lVar12);
      if (pvVar5 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar5,GImAllocatorUserData);
      }
      pvVar5 = *(void **)((long)&pIVar4->ID + lVar12);
      if (pvVar5 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar5,GImAllocatorUserData);
      }
      uVar11 = uVar11 + 1;
      uVar10 = (ulong)(uint)(this->ColumnsStorage).Size;
      lVar12 = lVar12 + 0x88;
    } while (uVar11 != uVar10);
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  pIVar4 = (this->ColumnsStorage).Data;
  if (pIVar4 != (ImGuiOldColumns *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
  }
  pIVar6 = (this->StateStorage).Data.Data;
  if (pIVar6 != (ImGuiStoragePair *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
  }
  pfVar7 = (this->DC).TextWrapPosStack.Data;
  if (pfVar7 != (float *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pfVar7,GImAllocatorUserData);
  }
  pfVar7 = (this->DC).ItemWidthStack.Data;
  if (pfVar7 != (float *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pfVar7,GImAllocatorUserData);
  }
  ppIVar8 = (this->DC).ChildWindows.Data;
  if (ppIVar8 != (ImGuiWindow **)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
  }
  puVar9 = (this->IDStack).Data;
  if (puVar9 != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar9,GImAllocatorUserData);
  }
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiOldColumns();
}